

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O0

string * __thiscall
MD5::getDataChecksum_abi_cxx11_(string *__return_storage_ptr__,MD5 *this,char *buf,size_t len)

{
  size_t n;
  MD5 *this_00;
  undefined1 local_30 [8];
  MD5 m;
  size_t len_local;
  char *buf_local;
  
  m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)buf;
  MD5((MD5 *)local_30,(uchar *)this,(size_t)buf,(uchar *)len);
  encodeDataIncrementally
            ((MD5 *)local_30,(char *)this,
             (size_t)m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  this_00 = (MD5 *)local_30;
  unparse_abi_cxx11_(__return_storage_ptr__,this_00);
  ~MD5((MD5 *)local_30,(uchar *)this_00,n,(uchar *)len);
  return __return_storage_ptr__;
}

Assistant:

std::string
MD5::getDataChecksum(char const* buf, size_t len)
{
    MD5 m;
    m.encodeDataIncrementally(buf, len);
    return m.unparse();
}